

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

field<discordpp::User> * __thiscall
discordpp::field<discordpp::User>::operator=(field<discordpp::User> *this,field<discordpp::User> *f)

{
  _Head_base<0UL,_discordpp::User_*,_false> _Var1;
  User *this_00;
  
  _Var1._M_head_impl =
       (f->t_)._M_t.super___uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_>.
       _M_t.super__Tuple_impl<0UL,_discordpp::User_*,_std::default_delete<discordpp::User>_>.
       super__Head_base<0UL,_discordpp::User_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (User *)0x0) {
    this_00 = (pointer)0x0;
  }
  else {
    this_00 = (User *)operator_new(0x150);
    User::User(this_00,_Var1._M_head_impl);
  }
  std::__uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_>::reset
            ((__uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_> *)this,this_00
            );
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }